

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O2

WeightParamType CoreML::valueType(WeightParams *param)

{
  int iVar1;
  
  iVar1 = numberOfWeightType(param);
  if (1 < iVar1) {
    return UNSPECIFIED;
  }
  if (iVar1 != 0) {
    if (0 < (param->floatvalue_).current_size_) {
      return FLOAT32;
    }
    if (((param->float16value_).ptr_)->_M_string_length != 0) {
      return FLOAT16;
    }
    if (((((param->rawvalue_).ptr_)->_M_string_length != 0) &&
        (param != (WeightParams *)&Specification::_WeightParams_default_instance_)) &&
       (param->quantization_ != (QuantizationParams *)0x0)) {
      return QUINT;
    }
    if (((((param->int8rawvalue_).ptr_)->_M_string_length != 0) &&
        (param != (WeightParams *)&Specification::_WeightParams_default_instance_)) &&
       (param->quantization_ != (QuantizationParams *)0x0)) {
      return QINT;
    }
  }
  return EMPTY;
}

Assistant:

inline WeightParamType valueType(const Specification::WeightParams &param) {
        int nw = numberOfWeightType(param);
        // Ensure only one field is set
        if (nw > 1){
            return UNSPECIFIED;
        }
        if (nw == 0){
            return EMPTY;
        }
        if (param.floatvalue_size() > 0) {
            return FLOAT32;
        } else if (param.float16value().size() > 0) {
            return FLOAT16;
        } else if (param.rawvalue().size() > 0 && param.has_quantization()) {
            return QUINT;
        } else if (param.int8rawvalue().size() > 0 && param.has_quantization()) {
            return QINT;
        }
        return EMPTY;
    }